

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreewidget.cpp
# Opt level: O0

void QTreeWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  QTreeWidgetItem *_t1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QTreeWidget *_t;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  QTreeWidget *in_stack_ffffffffffffff30;
  ScrollHint hint;
  QTreeWidgetItem *in_stack_ffffffffffffff38;
  int *piVar3;
  QTreeWidget *in_stack_ffffffffffffff40;
  
  if (in_ESI == 0) {
    _t1 = (QTreeWidgetItem *)(ulong)in_EDX;
    hint = (ScrollHint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    switch(_t1) {
    case (QTreeWidgetItem *)0x0:
      itemPressed((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),_t1,
                  in_stack_ffffffffffffff24);
      break;
    case (QTreeWidgetItem *)0x1:
      itemClicked((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),_t1,
                  in_stack_ffffffffffffff24);
      break;
    case (QTreeWidgetItem *)0x2:
      itemDoubleClicked((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                        ,_t1,in_stack_ffffffffffffff24);
      break;
    case (QTreeWidgetItem *)0x3:
      itemActivated((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),_t1
                    ,in_stack_ffffffffffffff24);
      break;
    case (QTreeWidgetItem *)0x4:
      itemEntered((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),_t1,
                  in_stack_ffffffffffffff24);
      break;
    case (QTreeWidgetItem *)0x5:
      itemChanged((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),_t1,
                  in_stack_ffffffffffffff24);
      break;
    case (QTreeWidgetItem *)0x6:
      itemExpanded((QTreeWidget *)0x91a1a9,
                   (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
      ;
      break;
    case (QTreeWidgetItem *)0x7:
      itemCollapsed((QTreeWidget *)0x91a1ca,
                    (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                   );
      break;
    case (QTreeWidgetItem *)0x8:
      currentItemChanged((QTreeWidget *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),_t1,
                         (QTreeWidgetItem *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      break;
    case (QTreeWidgetItem *)0x9:
      itemSelectionChanged((QTreeWidget *)0x91a20c);
      break;
    case (QTreeWidgetItem *)0xa:
      scrollToItem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,hint);
      break;
    case (QTreeWidgetItem *)0xb:
      scrollToItem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,hint);
      break;
    case (QTreeWidgetItem *)0xc:
      expandItem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case (QTreeWidgetItem *)0xd:
      collapseItem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case (QTreeWidgetItem *)0xe:
      clear((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
  }
  if ((in_ESI != 5) ||
     ((((((bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                             (in_RCX,(void **)itemPressed,0,0), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                             (in_RCX,(void **)itemClicked,0,1), !bVar1)) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                            (in_RCX,(void **)itemDoubleClicked,0,2), !bVar1)) &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                            (in_RCX,(void **)itemActivated,0,3), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                            (in_RCX,(void **)itemEntered,0,4), !bVar1)))) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                           (in_RCX,(void **)itemChanged,0,5), !bVar1 &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*)>
                            (in_RCX,(void **)itemExpanded,0,6), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*)>
                            (in_RCX,(void **)itemCollapsed,0,7), !bVar1)))))) &&
      ((bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,QTreeWidgetItem*)>
                          (in_RCX,(void **)currentItemChanged,0,8), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)()>
                          (in_RCX,(void **)itemSelectionChanged,0,9), !bVar1)))))) {
    if (in_ESI == 1) {
      piVar3 = *(int **)in_RCX;
      in_stack_ffffffffffffff24 = in_EDX;
      if (in_EDX == 0) {
        iVar2 = columnCount(in_stack_ffffffffffffff30);
        *piVar3 = iVar2;
      }
      else if (in_EDX == 1) {
        iVar2 = topLevelItemCount((QTreeWidget *)CONCAT44(1,in_stack_ffffffffffffff20));
        *piVar3 = iVar2;
      }
    }
    if ((in_ESI == 2) && (in_EDX == 0)) {
      setColumnCount((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
    }
  }
  return;
}

Assistant:

void QTreeWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->itemExpanded((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 7: _t->itemCollapsed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 8: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[2]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 12: _t->expandItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 13: _t->collapseItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 14: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemExpanded, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemCollapsed, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , QTreeWidgetItem * )>(_a, &QTreeWidget::currentItemChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)()>(_a, &QTreeWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->topLevelItemCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}